

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O2

void __thiscall
gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::freeAll
          (StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *this)

{
  Input *pIVar1;
  Input **ppIVar2;
  uint uVar3;
  int ii;
  ulong uVar4;
  long lVar5;
  int jj;
  ulong uVar6;
  
  if (this->dataptr != (Input **)0x0) {
    uVar4 = (ulong)(uint)this->bsize;
    lVar5 = uVar4 * 0x130;
    while( true ) {
      if ((int)uVar4 < 1) break;
      (*(code *)**(undefined8 **)
                  ((long)&this->dataptr[this->dataSlotIndex][-1].super_Interface._vptr_Interface +
                  lVar5))((long)&this->dataptr[this->dataSlotIndex][-1].super_Interface.
                                 _vptr_Interface + lVar5);
      uVar4 = (ulong)((int)uVar4 - 1);
      lVar5 = lVar5 + -0x130;
    }
    uVar3 = this->dataSlotIndex;
    if (0 < (long)(int)uVar3) {
      operator_delete(this->dataptr[(int)uVar3],0x2600);
      uVar3 = this->dataSlotIndex;
    }
    uVar4 = (ulong)uVar3;
    while (0 < (int)uVar4) {
      uVar4 = uVar4 - 1;
      uVar6 = 0x1f;
      while( true ) {
        pIVar1 = this->dataptr[uVar4];
        if ((int)uVar6 < 0) break;
        (**pIVar1[uVar6].super_Interface._vptr_Interface)(pIVar1 + uVar6);
        uVar6 = (ulong)((int)uVar6 - 1);
      }
      operator_delete(pIVar1,0x2600);
    }
    if (this->dataSlotIndex == 0) {
      operator_delete(*this->dataptr,0x2600);
    }
    for (lVar5 = 0; ppIVar2 = this->freeblocks, lVar5 < this->freeIndex; lVar5 = lVar5 + 1) {
      operator_delete(ppIVar2[lVar5],0x2600);
    }
    if (ppIVar2 != (Input **)0x0) {
      operator_delete__(ppIVar2);
    }
    if (this->dataptr != (Input **)0x0) {
      operator_delete__(this->dataptr);
      return;
    }
  }
  return;
}

Assistant:

void freeAll()
        {
            if (dataptr != nullptr) {
                Allocator a;
                for (int jj = bsize - 1; jj >= 0;
                     --jj) {  // call destructors on the last block
                    dataptr[dataSlotIndex][jj].~X();
                }
                if (dataSlotIndex > 0) {
                    a.deallocate(dataptr[dataSlotIndex], blockSize);
                }
                // go in reverse order
                for (int ii = dataSlotIndex - 1; ii >= 0; --ii) {
                    for (int jj = blockSize - 1; jj >= 0;
                         --jj) {  // call destructors on the middle blocks
                        dataptr[ii][jj].~X();
                    }
                    a.deallocate(dataptr[ii], blockSize);
                }
                if (dataSlotIndex == 0) {
                    a.deallocate(dataptr[0], blockSize);
                }

                for (int ii = 0; ii < freeIndex; ++ii) {
                    a.deallocate(freeblocks[ii], blockSize);
                }
                // delete can handle a nullptr
                delete[] freeblocks;
                delete[] dataptr;
            }
        }